

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::ItemAdd(ImRect *bb,ImGuiID id,ImRect *nav_bb_arg,ImGuiItemFlags extra_flags)

{
  float *pfVar1;
  short *psVar2;
  byte *pbVar3;
  ImGuiItemStatusFlags *pIVar4;
  int *piVar5;
  ImRect *pIVar6;
  ImVec2 IVar7;
  ImGuiID IVar8;
  ImGuiID IVar9;
  uint uVar10;
  int iVar11;
  ImGuiWindow *pIVar12;
  ImGuiWindow *pIVar13;
  ImGuiWindow *window;
  ImGuiContext *pIVar14;
  bool bVar15;
  uint uVar16;
  ImGuiContext *g;
  ImGuiNavItemData *result;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  
  pIVar14 = GImGui;
  pIVar12 = GImGui->CurrentWindow;
  (GImGui->LastItemData).ID = id;
  IVar7 = bb->Max;
  (pIVar14->LastItemData).Rect.Min = bb->Min;
  (pIVar14->LastItemData).Rect.Max = IVar7;
  if (nav_bb_arg == (ImRect *)0x0) {
    nav_bb_arg = bb;
  }
  IVar7 = nav_bb_arg->Max;
  (pIVar14->LastItemData).NavRect.Min = nav_bb_arg->Min;
  (pIVar14->LastItemData).NavRect.Max = IVar7;
  uVar16 = extra_flags | pIVar14->CurrentItemFlags;
  (pIVar14->LastItemData).InFlags = uVar16;
  (pIVar14->LastItemData).StatusFlags = 0;
  if (id != 0) {
    if (pIVar14->ActiveId == id) {
      pIVar14->ActiveIdIsAlive = id;
    }
    if (pIVar14->ActiveIdPreviousFrame == id) {
      pIVar14->ActiveIdPreviousFrameIsAlive = true;
    }
    if ((uVar16 & 8) == 0) {
      psVar2 = &(pIVar12->DC).NavLayersActiveMaskNext;
      *psVar2 = *psVar2 | (ushort)(1 << ((char)(pIVar12->DC).NavLayerCurrent & 0x1f));
      IVar8 = pIVar14->NavId;
      if ((((IVar8 == id) || (pIVar14->NavAnyRequest == true)) &&
          (pIVar13 = pIVar14->NavWindow, pIVar13->RootWindowForNav == pIVar12->RootWindowForNav)) &&
         ((pIVar12 == pIVar13 || (((uint)(pIVar13->Flags | pIVar12->Flags) >> 0x17 & 1) != 0)))) {
        window = pIVar14->CurrentWindow;
        IVar9 = (pIVar14->LastItemData).ID;
        IVar7 = (pIVar14->LastItemData).NavRect.Min;
        fVar20 = IVar7.x;
        fVar21 = IVar7.y;
        IVar7 = (pIVar14->LastItemData).NavRect.Max;
        fVar22 = IVar7.x;
        fVar23 = IVar7.y;
        uVar16 = (pIVar14->LastItemData).InFlags;
        bVar15 = pIVar14->NavInitRequest;
        if ((bVar15 == true) &&
           ((uVar16 & 4) == 0 && pIVar14->NavLayer == (window->DC).NavLayerCurrent)) {
          if ((uVar16 & 0x10) == 0) {
            pIVar14->NavInitResultId = IVar9;
            IVar7 = (window->DC).CursorStartPos;
            fVar17 = IVar7.x;
            fVar18 = IVar7.y;
            (pIVar14->NavInitResultRectRel).Min.x = fVar20 - fVar17;
            (pIVar14->NavInitResultRectRel).Min.y = fVar21 - fVar18;
            (pIVar14->NavInitResultRectRel).Max.x = fVar22 - fVar17;
            (pIVar14->NavInitResultRectRel).Max.y = fVar23 - fVar18;
LAB_001ef70f:
            pIVar14->NavInitRequest = false;
            pIVar14->NavAnyRequest = pIVar14->NavMoveScoringItems;
            bVar15 = false;
          }
          else if (pIVar14->NavInitResultId == 0) {
            pIVar14->NavInitResultId = IVar9;
            IVar7 = (window->DC).CursorStartPos;
            fVar17 = IVar7.x;
            fVar18 = IVar7.y;
            (pIVar14->NavInitResultRectRel).Min.x = fVar20 - fVar17;
            (pIVar14->NavInitResultRectRel).Min.y = fVar21 - fVar18;
            (pIVar14->NavInitResultRectRel).Max.x = fVar22 - fVar17;
            (pIVar14->NavInitResultRectRel).Max.y = fVar23 - fVar18;
            if ((uVar16 & 0x10) == 0) goto LAB_001ef70f;
          }
        }
        if (pIVar14->NavMoveScoringItems == true) {
          uVar10 = pIVar14->NavMoveFlags;
          if ((uVar10 >> 10 & 1) == 0) {
            if ((uVar16 & 4) == 0 && ((uVar10 & 0x10) != 0 || IVar8 != IVar9)) {
              result = &pIVar14->NavMoveResultOther;
              if (window == pIVar13) {
                result = &pIVar14->NavMoveResultLocal;
              }
              bVar15 = NavScoreItem(result);
              if (bVar15) {
                NavApplyItemToResult(result);
              }
              if ((((pIVar14->NavMoveFlags & 0x20) != 0) &&
                  (fVar17 = (window->ClipRect).Max.y, fVar21 < fVar17)) &&
                 ((fVar18 = (window->ClipRect).Min.y, fVar18 < fVar23 &&
                  ((fVar20 < (window->ClipRect).Max.x &&
                   ((window->ClipRect).Min.x <= fVar22 && fVar22 != (window->ClipRect).Min.x)))))) {
                fVar19 = fVar17;
                if (fVar23 <= fVar17) {
                  fVar19 = fVar23;
                }
                if (fVar21 <= fVar17) {
                  fVar17 = fVar21;
                }
                if ((fVar23 - fVar21) * 0.7 <=
                    (float)(-(uint)(fVar23 < fVar18) & (uint)fVar18 |
                           ~-(uint)(fVar23 < fVar18) & (uint)fVar19) -
                    (float)(-(uint)(fVar21 < fVar18) & (uint)fVar18 |
                           ~-(uint)(fVar21 < fVar18) & (uint)fVar17)) {
                  bVar15 = NavScoreItem(&pIVar14->NavMoveResultLocalVisible);
                  if (bVar15) {
                    NavApplyItemToResult(&pIVar14->NavMoveResultLocalVisible);
                  }
                }
              }
            }
          }
          else if ((uVar16 & 0x405) == 0x400 || (uVar10 >> 9 & 1) != 0) {
            iVar11 = pIVar14->NavTabbingDir;
            if (iVar11 == -1) {
              if (IVar8 == IVar9) {
                if ((pIVar14->NavMoveResultLocal).ID != 0) {
                  pIVar14->NavMoveScoringItems = false;
                  pIVar14->NavAnyRequest = bVar15;
                }
              }
              else {
                NavApplyItemToResult(&pIVar14->NavMoveResultLocal);
              }
            }
            else if (iVar11 == 0) {
              if ((pIVar14->NavTabbingResultFirst).ID == 0) {
                pIVar14->NavMoveScoringItems = false;
                NavApplyItemToResult(&pIVar14->NavTabbingResultFirst);
                bVar15 = true;
                if (GImGui->NavMoveScoringItems == false) {
                  bVar15 = GImGui->NavInitRequest;
                }
                GImGui->NavAnyRequest = bVar15;
              }
            }
            else if (iVar11 == 1) {
              if ((pIVar14->NavTabbingResultFirst).ID == 0) {
                NavApplyItemToResult(&pIVar14->NavTabbingResultFirst);
              }
              piVar5 = &pIVar14->NavTabbingCounter;
              *piVar5 = *piVar5 + -1;
              if (*piVar5 == 0) {
                GImGui->NavMoveScoringItems = false;
                NavApplyItemToResult(&pIVar14->NavMoveResultLocal);
                bVar15 = true;
                if (GImGui->NavMoveScoringItems == false) {
                  bVar15 = GImGui->NavInitRequest;
                }
                GImGui->NavAnyRequest = bVar15;
              }
              else if (pIVar14->NavId == IVar9) {
                pIVar14->NavTabbingCounter = 1;
              }
            }
          }
        }
        if (pIVar14->NavId == IVar9) {
          if (pIVar14->NavWindow != window) {
            SetNavWindow(window);
          }
          pIVar14->NavLayer = (window->DC).NavLayerCurrent;
          pIVar14->NavFocusScopeId = pIVar14->CurrentFocusScopeId;
          pIVar14->NavIdIsAlive = true;
          IVar7 = (window->DC).CursorStartPos;
          fVar17 = IVar7.x;
          fVar18 = IVar7.y;
          pIVar6 = window->NavRectRel + (window->DC).NavLayerCurrent;
          (pIVar6->Min).x = fVar20 - fVar17;
          (pIVar6->Min).y = fVar21 - fVar18;
          (pIVar6->Max).x = fVar22 - fVar17;
          (pIVar6->Max).y = fVar23 - fVar18;
        }
      }
    }
  }
  (pIVar14->NextItemData).Flags = 0;
  fVar20 = (bb->Max).y;
  pfVar1 = &(pIVar12->ClipRect).Min.y;
  if ((((fVar20 < *pfVar1 || fVar20 == *pfVar1) ||
       (fVar20 = (pIVar12->ClipRect).Max.y, pfVar1 = &(bb->Min).y,
       fVar20 < *pfVar1 || fVar20 == *pfVar1)) ||
      (fVar20 = (bb->Max).x,
      fVar20 < (pIVar12->ClipRect).Min.x || fVar20 == (pIVar12->ClipRect).Min.x)) ||
     (fVar20 = (pIVar12->ClipRect).Max.x, bVar15 = true,
     fVar20 < (bb->Min).x || fVar20 == (bb->Min).x)) {
    if ((id == 0) || ((pIVar14->ActiveId != id && (pIVar14->NavId != id)))) {
      bVar15 = false;
      if (pIVar14->LogEnabled != true) {
        return false;
      }
      goto LAB_001ef61a;
    }
    bVar15 = false;
  }
  else {
LAB_001ef61a:
    if (id == 0) goto LAB_001ef62d;
  }
  if (pIVar14->DebugLocateId == id) {
    DebugLocateItemResolveWithLastItem();
  }
LAB_001ef62d:
  if (bVar15) {
    pbVar3 = (byte *)((long)&(pIVar14->LastItemData).StatusFlags + 1);
    *pbVar3 = *pbVar3 | 2;
  }
  bVar15 = IsMouseHoveringRect(&bb->Min,&bb->Max,true);
  if (bVar15) {
    pIVar4 = &(pIVar14->LastItemData).StatusFlags;
    *(byte *)pIVar4 = (byte)*pIVar4 | 1;
  }
  return true;
}

Assistant:

bool ImGui::ItemAdd(const ImRect& bb, ImGuiID id, const ImRect* nav_bb_arg, ImGuiItemFlags extra_flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    // Set item data
    // (DisplayRect is left untouched, made valid when ImGuiItemStatusFlags_HasDisplayRect is set)
    g.LastItemData.ID = id;
    g.LastItemData.Rect = bb;
    g.LastItemData.NavRect = nav_bb_arg ? *nav_bb_arg : bb;
    g.LastItemData.InFlags = g.CurrentItemFlags | extra_flags;
    g.LastItemData.StatusFlags = ImGuiItemStatusFlags_None;

    // Directional navigation processing
    if (id != 0)
    {
        KeepAliveID(id);

        // Runs prior to clipping early-out
        //  (a) So that NavInitRequest can be honored, for newly opened windows to select a default widget
        //  (b) So that we can scroll up/down past clipped items. This adds a small O(N) cost to regular navigation requests
        //      unfortunately, but it is still limited to one window. It may not scale very well for windows with ten of
        //      thousands of item, but at least NavMoveRequest is only set on user interaction, aka maximum once a frame.
        //      We could early out with "if (is_clipped && !g.NavInitRequest) return false;" but when we wouldn't be able
        //      to reach unclipped widgets. This would work if user had explicit scrolling control (e.g. mapped on a stick).
        // We intentionally don't check if g.NavWindow != NULL because g.NavAnyRequest should only be set when it is non null.
        // If we crash on a NULL g.NavWindow we need to fix the bug elsewhere.
        if (!(g.LastItemData.InFlags & ImGuiItemFlags_NoNav))
        {
            window->DC.NavLayersActiveMaskNext |= (1 << window->DC.NavLayerCurrent);
            if (g.NavId == id || g.NavAnyRequest)
                if (g.NavWindow->RootWindowForNav == window->RootWindowForNav)
                    if (window == g.NavWindow || ((window->Flags | g.NavWindow->Flags) & ImGuiWindowFlags_NavFlattened))
                        NavProcessItem();
        }

        // [DEBUG] People keep stumbling on this problem and using "" as identifier in the root of a window instead of "##something".
        // Empty identifier are valid and useful in a small amount of cases, but 99.9% of the time you want to use "##something".
        // READ THE FAQ: https://dearimgui.org/faq
        IM_ASSERT(id != window->ID && "Cannot have an empty ID at the root of a window. If you need an empty label, use ## and read the FAQ about how the ID Stack works!");
    }
    g.NextItemData.Flags = ImGuiNextItemDataFlags_None;

#ifdef IMGUI_ENABLE_TEST_ENGINE
    if (id != 0)
        IMGUI_TEST_ENGINE_ITEM_ADD(nav_bb_arg ? *nav_bb_arg : bb, id);
#endif

    // Clipping test
    // (FIXME: This is a modified copy of IsClippedEx() so we can reuse the is_rect_visible value)
    //const bool is_clipped = IsClippedEx(bb, id);
    //if (is_clipped)
    //    return false;
    const bool is_rect_visible = bb.Overlaps(window->ClipRect);
    if (!is_rect_visible)
        if (id == 0 || (id != g.ActiveId && id != g.NavId))
            if (!g.LogEnabled)
                return false;

    // [DEBUG]
#ifndef IMGUI_DISABLE_DEBUG_TOOLS
    if (id != 0 && id == g.DebugLocateId)
        DebugLocateItemResolveWithLastItem();
#endif
    //if (g.IO.KeyAlt) window->DrawList->AddRect(bb.Min, bb.Max, IM_COL32(255,255,0,120)); // [DEBUG]

    // We need to calculate this now to take account of the current clipping rectangle (as items like Selectable may change them)
    if (is_rect_visible)
        g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_Visible;
    if (IsMouseHoveringRect(bb.Min, bb.Max))
        g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_HoveredRect;
    return true;
}